

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

coeff_buf * __thiscall
jpgd::jpeg_decoder::coeff_buf_open
          (jpeg_decoder *this,int block_num_x,int block_num_y,int block_len_x,int block_len_y)

{
  coeff_buf *pcVar1;
  uint8 *puVar2;
  coeff_buf *cb;
  int block_len_y_local;
  int block_len_x_local;
  int block_num_y_local;
  int block_num_x_local;
  jpeg_decoder *this_local;
  
  pcVar1 = (coeff_buf *)alloc(this,0x20,false);
  pcVar1->block_num_x = block_num_x;
  pcVar1->block_num_y = block_num_y;
  pcVar1->block_len_x = block_len_x;
  pcVar1->block_len_y = block_len_y;
  pcVar1->block_size = block_len_x * block_len_y * 2;
  puVar2 = (uint8 *)alloc(this,(long)(pcVar1->block_size * block_num_x * block_num_y),true);
  pcVar1->pData = puVar2;
  return pcVar1;
}

Assistant:

jpeg_decoder::coeff_buf* jpeg_decoder::coeff_buf_open(int block_num_x, int block_num_y, int block_len_x, int block_len_y)
	{
		coeff_buf* cb = (coeff_buf*)alloc(sizeof(coeff_buf));

		cb->block_num_x = block_num_x;
		cb->block_num_y = block_num_y;
		cb->block_len_x = block_len_x;
		cb->block_len_y = block_len_y;
		cb->block_size = (block_len_x * block_len_y) * sizeof(jpgd_block_coeff_t);
		cb->pData = (uint8*)alloc(cb->block_size * block_num_x * block_num_y, true);
		return cb;
	}